

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

FlagBase * __thiscall
args::
MapFlagList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_args::detail::vector,_args::ValueReader,_args::detail::unordered_map>
::Match(MapFlagList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_args::detail::vector,_args::ValueReader,_args::detail::unordered_map>
        *this,EitherFlag *arg)

{
  uint uVar1;
  FlagBase *pFVar2;
  FlagBase *me;
  bool wasMatched;
  EitherFlag *arg_local;
  MapFlagList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_args::detail::vector,_args::ValueReader,_args::detail::unordered_map>
  *this_local;
  
  uVar1 = (*(this->super_ValueFlagBase).super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  pFVar2 = FlagBase::Match((FlagBase *)this,arg);
  if ((pFVar2 != (FlagBase *)0x0) && ((uVar1 & 1) == 0)) {
    std::vector<MappingEnum,_std::allocator<MappingEnum>_>::clear(&this->values);
  }
  return pFVar2;
}

Assistant:

virtual FlagBase *Match(const EitherFlag &arg) override
            {
                const bool wasMatched = Matched();
                auto me = FlagBase::Match(arg);
                if (me && !wasMatched)
                {
                    values.clear();
                }
                return me;
            }